

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

MessageLite *
google::protobuf::internal::GetOwnedMessageInternal
          (Arena *message_arena,MessageLite *submessage,Arena *submessage_arena)

{
  Arena *pAVar1;
  char *failure_msg;
  MessageLite *this;
  int line;
  Arena *local_28;
  LogMessage local_20;
  
  pAVar1 = (Arena *)(submessage->_internal_metadata_).ptr_;
  if (((ulong)pAVar1 & 1) != 0) {
    pAVar1 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
  }
  local_28 = submessage_arena;
  if (pAVar1 == submessage_arena) {
    if (submessage_arena == message_arena) {
      failure_msg = "message_arena != submessage_arena";
      line = 0x18e;
    }
    else {
      local_20.errno_saver_.saved_errno_ = 0;
      local_20._4_4_ = 0;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_EQImpl<google::protobuf::Arena*,decltype(nullptr)>
                              (&local_28,(void **)&local_20,"submessage_arena == nullptr");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        if ((message_arena == (Arena *)0x0) || (local_28 != (Arena *)0x0)) {
          this = MessageLite::New(submessage,message_arena);
          MessageLite::CheckTypeAndMergeFrom(this,submessage);
        }
        else {
          ThreadSafeArena::AddCleanup
                    (&message_arena->impl_,submessage,
                     arena_delete_object<google::protobuf::MessageLite>);
          this = submessage;
        }
        return this;
      }
      line = 399;
    }
  }
  else {
    failure_msg = "submessage->GetArena() == submessage_arena";
    line = 0x18d;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_util.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

MessageLite* GetOwnedMessageInternal(Arena* message_arena,
                                     MessageLite* submessage,
                                     Arena* submessage_arena) {
  ABSL_DCHECK(submessage->GetArena() == submessage_arena);
  ABSL_DCHECK(message_arena != submessage_arena);
  ABSL_DCHECK_EQ(submessage_arena, nullptr);
  if (message_arena != nullptr && submessage_arena == nullptr) {
    message_arena->Own(submessage);
    return submessage;
  } else {
    MessageLite* ret = submessage->New(message_arena);
    ret->CheckTypeAndMergeFrom(*submessage);
    return ret;
  }
}